

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGeneratorTarget.cxx
# Opt level: O1

void __thiscall
cmGeneratorTarget::ComputeLinkClosure(cmGeneratorTarget *this,string *config,LinkClosure *lc)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  char *pcVar2;
  LinkClosure *pLVar3;
  bool bVar4;
  cmLinkImplementation *pcVar5;
  char *pcVar6;
  long *plVar7;
  long lVar8;
  size_type *psVar9;
  long lVar10;
  pointer item;
  pointer pbVar11;
  string propagates;
  const_iterator li;
  hash_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmsys::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<char>_>
  languages;
  const_iterator sit;
  cmTargetCollectLinkLanguages cll;
  string local_160;
  LinkClosure *local_140;
  undefined1 local_138 [16];
  undefined1 local_128 [16];
  undefined1 local_118 [24];
  _Base_ptr local_100;
  size_t local_f8;
  undefined1 local_f0 [72];
  _Hashtable_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmsys::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_cmsys::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<char>_>
  local_a8;
  undefined1 local_98 [56];
  _Rb_tree<const_cmGeneratorTarget_*,_const_cmGeneratorTarget_*,_std::_Identity<const_cmGeneratorTarget_*>,_std::less<const_cmGeneratorTarget_*>,_std::allocator<const_cmGeneratorTarget_*>_>
  local_60;
  
  cmsys::
  hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmsys::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_cmsys::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<char>_>
  ::hashtable((hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmsys::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_cmsys::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<char>_>
               *)local_f0,100,
              (hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               *)local_98,
              (equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               *)local_138,(allocator_type *)&local_160);
  pcVar5 = GetLinkImplementation(this,config);
  local_140 = lc;
  if (pcVar5 == (cmLinkImplementation *)0x0) {
    __assert_fail("impl",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/fjeremic[P]CMake/Source/cmGeneratorTarget.cxx"
                  ,0x79d,
                  "void cmGeneratorTarget::ComputeLinkClosure(const std::string &, LinkClosure &) const"
                 );
  }
  pbVar11 = (pcVar5->Languages).
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start;
  if (pbVar11 !=
      (pcVar5->Languages).
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    do {
      cmsys::
      hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmsys::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_cmsys::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<char>_>
      ::resize((hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmsys::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_cmsys::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<char>_>
                *)local_f0,(size_type)(local_f0._32_8_ + 1));
      cmsys::
      hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmsys::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_cmsys::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<char>_>
      ::insert_unique_noresize
                ((pair<cmsys::_Hashtable_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmsys::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_cmsys::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<char>_>,_bool>
                  *)local_98,
                 (hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmsys::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_cmsys::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<char>_>
                  *)local_f0,pbVar11);
      pbVar11 = pbVar11 + 1;
    } while (pbVar11 !=
             (pcVar5->Languages).
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish);
  }
  cmTargetCollectLinkLanguages::cmTargetCollectLinkLanguages
            ((cmTargetCollectLinkLanguages *)local_98,this,config,
             (hash_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmsys::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<char>_>
              *)local_f0,this);
  pLVar3 = local_140;
  item = (pcVar5->super_cmLinkImplementationLibraries).Libraries.
         super__Vector_base<cmLinkImplItem,_std::allocator<cmLinkImplItem>_>._M_impl.
         super__Vector_impl_data._M_start;
  if (item != (pcVar5->super_cmLinkImplementationLibraries).Libraries.
              super__Vector_base<cmLinkImplItem,_std::allocator<cmLinkImplItem>_>._M_impl.
              super__Vector_impl_data._M_finish) {
    do {
      cmTargetCollectLinkLanguages::Visit
                ((cmTargetCollectLinkLanguages *)local_98,&item->super_cmLinkItem);
      item = item + 1;
    } while (item != (pcVar5->super_cmLinkImplementationLibraries).Libraries.
                     super__Vector_base<cmLinkImplItem,_std::allocator<cmLinkImplItem>_>._M_impl.
                     super__Vector_impl_data._M_finish);
  }
  if (local_f0._16_8_ - local_f0._8_8_ != 0) {
    lVar8 = (long)(local_f0._16_8_ - local_f0._8_8_) >> 3;
    lVar10 = 0;
    do {
      local_138._0_8_ =
           *(pointer)((long)&(((set<cmListFileContext,_std::less<cmListFileContext>,_std::allocator<cmListFileContext>_>
                                *)local_f0._8_8_)->_M_t)._M_impl.field_0x0 + lVar10 * 8);
      if ((_Hashtable_node<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           *)local_138._0_8_ !=
          (_Hashtable_node<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           *)0x0) goto LAB_0037d72a;
      lVar10 = lVar10 + 1;
    } while (lVar8 + (ulong)(lVar8 == 0) != lVar10);
  }
  local_138._0_8_ =
       (_Hashtable_node<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        *)0x0;
LAB_0037d72a:
  local_138._8_8_ = (cmGeneratorTarget *)local_f0;
  while ((_Hashtable_node<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          *)local_138._0_8_ !=
         (_Hashtable_node<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          *)0x0) {
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back(&pLVar3->Languages,(value_type *)(local_138._0_8_ + 8));
    cmsys::
    _Hashtable_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmsys::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_cmsys::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<char>_>
    ::operator++((_Hashtable_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmsys::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_cmsys::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<char>_>
                  *)local_138);
  }
  local_138._0_8_ = (_Node *)local_128;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_138,"HAS_CXX","");
  pcVar6 = cmTarget::GetProperty(this->Target,(string *)local_138);
  if ((_Node *)local_138._0_8_ != (_Node *)local_128) {
    operator_delete((void *)local_138._0_8_,(ulong)(local_128._0_8_ + 1));
  }
  if (pcVar6 == (char *)0x0) {
    local_138._0_8_ = (_Node *)local_128;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_138,"LINKER_LANGUAGE","");
    pcVar6 = cmTarget::GetProperty(this->Target,(string *)local_138);
    if ((_Node *)local_138._0_8_ != (_Node *)local_128) {
      operator_delete((void *)local_138._0_8_,(ulong)(local_128._0_8_ + 1));
    }
    if (pcVar6 == (char *)0x0) {
      local_118._16_8_ = local_118;
      local_138._0_8_ = local_138._0_8_ & 0xffffffff00000000;
      local_118._0_4_ = _S_red;
      local_118._8_8_ = 0;
      local_f8 = 0;
      local_128._0_8_ = this->LocalGenerator->GlobalGenerator;
      pbVar11 = (pcVar5->Languages).
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
      local_138._8_8_ = this;
      local_100 = (_Base_ptr)local_118._16_8_;
      if (pbVar11 !=
          (pcVar5->Languages).
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_finish) {
        do {
          cmTargetSelectLinker::Consider
                    ((cmTargetSelectLinker *)local_138,(pbVar11->_M_dataplus)._M_p);
          pbVar11 = pbVar11 + 1;
        } while (pbVar11 !=
                 (pcVar5->Languages).
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish);
      }
      if (local_f0._16_8_ - local_f0._8_8_ != 0) {
        lVar8 = (long)(local_f0._16_8_ - local_f0._8_8_) >> 3;
        lVar10 = 0;
        do {
          local_a8._M_cur =
               *(pointer)((long)&(((set<cmListFileContext,_std::less<cmListFileContext>,_std::allocator<cmListFileContext>_>
                                    *)local_f0._8_8_)->_M_t)._M_impl.field_0x0 + lVar10 * 8);
          if (local_a8._M_cur !=
              (_Hashtable_node<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               *)0x0) goto LAB_0037d8b9;
          lVar10 = lVar10 + 1;
        } while (lVar8 + (ulong)(lVar8 == 0) != lVar10);
      }
      local_a8._M_cur =
           (_Hashtable_node<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            *)0x0;
LAB_0037d8b9:
      paVar1 = &local_160.field_2;
      local_a8._M_ht = (_Hashtable *)local_f0;
      while (local_a8._M_cur !=
             (_Hashtable_node<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)0x0) {
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       (local_f0 + 0x28),"CMAKE_",&(local_a8._M_cur)->_M_val);
        plVar7 = (long *)std::__cxx11::string::append((char *)(local_f0 + 0x28));
        psVar9 = (size_type *)(plVar7 + 2);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*plVar7 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)psVar9) {
          local_160.field_2._M_allocated_capacity = *psVar9;
          local_160.field_2._8_8_ = plVar7[3];
          local_160._M_dataplus._M_p = (pointer)paVar1;
        }
        else {
          local_160.field_2._M_allocated_capacity = *psVar9;
          local_160._M_dataplus._M_p = (pointer)*plVar7;
        }
        local_160._M_string_length = plVar7[1];
        *plVar7 = (long)psVar9;
        plVar7[1] = 0;
        *(undefined1 *)(plVar7 + 2) = 0;
        if ((undefined1 *)local_f0._40_8_ != local_f0 + 0x38) {
          operator_delete((void *)local_f0._40_8_,local_f0._56_8_ + 1);
        }
        bVar4 = cmMakefile::IsOn(this->Makefile,&local_160);
        if (bVar4) {
          cmTargetSelectLinker::Consider
                    ((cmTargetSelectLinker *)local_138,((local_a8._M_cur)->_M_val)._M_dataplus._M_p)
          ;
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_160._M_dataplus._M_p != paVar1) {
          operator_delete(local_160._M_dataplus._M_p,local_160.field_2._M_allocated_capacity + 1);
        }
        cmsys::
        _Hashtable_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmsys::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_cmsys::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<char>_>
        ::operator++(&local_a8);
      }
      cmTargetSelectLinker::Choose_abi_cxx11_(&local_160,(cmTargetSelectLinker *)local_138);
      std::__cxx11::string::operator=((string *)local_140,(string *)&local_160);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_160._M_dataplus._M_p != paVar1) {
        operator_delete(local_160._M_dataplus._M_p,local_160.field_2._M_allocated_capacity + 1);
      }
      std::
      _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)(local_128 + 8));
    }
    else {
      pcVar2 = (char *)(pLVar3->LinkerLanguage)._M_string_length;
      strlen(pcVar6);
      std::__cxx11::string::_M_replace((ulong)pLVar3,0,pcVar2,(ulong)pcVar6);
    }
  }
  else {
    std::__cxx11::string::_M_replace
              ((ulong)pLVar3,0,(char *)(pLVar3->LinkerLanguage)._M_string_length,0x4ea5ad);
  }
  std::
  _Rb_tree<const_cmGeneratorTarget_*,_const_cmGeneratorTarget_*,_std::_Identity<const_cmGeneratorTarget_*>,_std::less<const_cmGeneratorTarget_*>,_std::allocator<const_cmGeneratorTarget_*>_>
  ::~_Rb_tree(&local_60);
  if ((_Node *)local_98._0_8_ != (_Node *)(local_98 + 0x10)) {
    operator_delete((void *)local_98._0_8_,local_98._16_8_ + 1);
  }
  cmsys::
  hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmsys::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_cmsys::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<char>_>
  ::~hashtable((hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmsys::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_cmsys::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<char>_>
                *)local_f0);
  return;
}

Assistant:

void cmGeneratorTarget::ComputeLinkClosure(const std::string& config,
                                           LinkClosure& lc) const
{
  // Get languages built in this target.
  UNORDERED_SET<std::string> languages;
  cmLinkImplementation const* impl =
                            this->GetLinkImplementation(config);
  assert(impl);
  for(std::vector<std::string>::const_iterator li = impl->Languages.begin();
      li != impl->Languages.end(); ++li)
    {
    languages.insert(*li);
    }

  // Add interface languages from linked targets.
  cmTargetCollectLinkLanguages cll(this, config, languages, this);
  for(std::vector<cmLinkImplItem>::const_iterator li = impl->Libraries.begin();
      li != impl->Libraries.end(); ++li)
    {
    cll.Visit(*li);
    }

  // Store the transitive closure of languages.
  for(UNORDERED_SET<std::string>::const_iterator li = languages.begin();
      li != languages.end(); ++li)
    {
    lc.Languages.push_back(*li);
    }

  // Choose the language whose linker should be used.
  if(this->GetProperty("HAS_CXX"))
    {
    lc.LinkerLanguage = "CXX";
    }
  else if(const char* linkerLang = this->GetProperty("LINKER_LANGUAGE"))
    {
    lc.LinkerLanguage = linkerLang;
    }
  else
    {
    // Find the language with the highest preference value.
    cmTargetSelectLinker tsl(this);

    // First select from the languages compiled directly in this target.
    for(std::vector<std::string>::const_iterator li = impl->Languages.begin();
        li != impl->Languages.end(); ++li)
      {
      tsl.Consider(li->c_str());
      }

    // Now consider languages that propagate from linked targets.
    for(UNORDERED_SET<std::string>::const_iterator sit = languages.begin();
        sit != languages.end(); ++sit)
      {
      std::string propagates = "CMAKE_"+*sit+"_LINKER_PREFERENCE_PROPAGATES";
      if(this->Makefile->IsOn(propagates))
        {
        tsl.Consider(sit->c_str());
        }
      }

    lc.LinkerLanguage = tsl.Choose();
    }
}